

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_isDummyValue
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  _Var1 = sysbvm_tuple_isDummyValue(*arguments);
  return (ulong)_Var1 << 4 | 0xf;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_isDummyValue(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_boolean_encode(sysbvm_tuple_isDummyValue(arguments[0]));
}